

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FileDescriptorProto::SharedDtor(MessageLite *self)

{
  MessageLite *self_00;
  SourceCodeInfo *this;
  ulong uVar1;
  undefined8 extraout_RAX;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[0xc]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0xd));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[0xd]._internal_metadata_);
    self_00 = (MessageLite *)self[0xe]._vptr_MessageLite;
    if (self_00 != (MessageLite *)0x0) {
      FileOptions::SharedDtor(self_00);
      operator_delete(self_00,0xb0);
    }
    this = (SourceCodeInfo *)self[0xe]._internal_metadata_.ptr_;
    if (this != (SourceCodeInfo *)0x0) {
      SourceCodeInfo::~SourceCodeInfo(this);
      operator_delete(this,0x48);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(self + 0xb));
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 10));
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 9));
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
               &self[7]._internal_metadata_);
    RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)(self + 6));
    RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
               &self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::DescriptorProto> *)(self + 3));
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((FileDescriptorProto *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void FileDescriptorProto::SharedDtor(MessageLite& self) {
  FileDescriptorProto& this_ = static_cast<FileDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.package_.Destroy();
  this_._impl_.syntax_.Destroy();
  delete this_._impl_.options_;
  delete this_._impl_.source_code_info_;
  this_._impl_.~Impl_();
}